

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O3

void __thiscall imrt::Collimator::insertXorder(Collimator *this,double x)

{
  double dVar1;
  iterator __position;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  ulong uVar3;
  const_iterator __position_00;
  long lVar4;
  double local_18;
  
  local_18 = x;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position_00._M_current =
       (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  __position._M_current =
       (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar4 = (long)__position._M_current - (long)__position_00._M_current;
  if (lVar4 == 0 || _Var2._M_current != __position._M_current) {
    if (_Var2._M_current != __position._M_current) {
      return;
    }
  }
  else {
    uVar3 = 1;
    do {
      dVar1 = *__position_00._M_current;
      if (local_18 < dVar1) {
        std::vector<double,_std::allocator<double>_>::insert(&this->xcoord,__position_00,&local_18);
        return;
      }
      if ((ulong)(lVar4 >> 3) <= uVar3) break;
      __position_00._M_current = __position_00._M_current + 1;
      uVar3 = uVar3 + 1;
    } while (dVar1 <= local_18);
  }
  if (__position._M_current ==
      (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->xcoord,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void Collimator::insertXorder(double x) {
    bool flag=false;
    if (find(xcoord.begin(), xcoord.end(), x) != xcoord.end())
      flag=true;
    for (int j=0; j< xcoord.size() && !flag; j++) {
      if (xcoord[j] > x) {
        xcoord.insert(xcoord.begin()+j, x);
        flag=true;
      }
    }
    if (!flag) xcoord.push_back(x);
  }